

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O1

int PAL_wvsscanf(LPCWSTR Buffer,LPCWSTR Format,__va_list_tag *ap)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char16_t cVar6;
  FILE *pFVar7;
  int iVar8;
  int iVar9;
  errno_t eVar10;
  uint uVar11;
  DWORD DVar12;
  size_t sVar13;
  char *__nptr;
  long *plVar14;
  LPSTR lpMultiByteStr;
  size_t sVar15;
  int iVar16;
  undefined8 *puVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  char *_Dst;
  ulong uVar21;
  char16_t cVar22;
  char16_t *string;
  LPCWSTR pWVar23;
  LPCWSTR pWVar24;
  char *pcVar25;
  long in_FS_OFFSET;
  int local_468;
  uint local_44c;
  int iStack_448;
  int n;
  int local_440;
  int local_43c;
  undefined2 local_438;
  char local_436 [6];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  cVar22 = *Format;
  if (cVar22 == L'\0') {
    iVar8 = 0;
  }
  else {
    iVar20 = 0;
    _iStack_448 = 0xffffffff;
    pWVar24 = Buffer;
    do {
      if ((*pWVar24 == L'\0') && (iVar20 == 0)) {
        iVar8 = -1;
        break;
      }
      iVar8 = isspace((uint)(ushort)cVar22);
      if (iVar8 != 0) {
        pWVar23 = pWVar24 + -1;
        do {
          pWVar24 = pWVar23 + 1;
          pWVar23 = pWVar23 + 1;
          iVar8 = isspace((uint)(ushort)*pWVar24);
        } while (iVar8 != 0);
        string = Format + 1;
        goto LAB_001c4e98;
      }
      uVar21 = _iStack_448;
      string = Format;
      if (*Format != L'%') goto LAB_001c4e6c;
      string = Format + 1;
      local_438 = CONCAT11(local_438._1_1_,0x25);
      sVar13 = PAL_wcslen(string);
      __nptr = (char *)PAL_malloc(sVar13 + 1);
      local_43c = iVar20;
      if (__nptr == (char *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001c53c6;
        SetLastError(8);
        bVar4 = true;
        iVar9 = -1;
        bVar3 = true;
        uVar21 = 0xffffffff;
        iVar8 = -1;
        goto LAB_001c4e64;
      }
      cVar22 = *string;
      _Dst = (char *)((long)&local_438 + 1);
      if (cVar22 == L'*') {
        string = Format + 2;
        local_438 = CONCAT11(0x2a,(char)local_438);
        _Dst = local_436;
      }
      bVar3 = cVar22 != L'*';
      iVar8 = isdigit((uint)(ushort)*string);
      if (iVar8 == 0) {
        iVar9 = -1;
      }
      else {
        iVar8 = isdigit((uint)(ushort)*string);
        pcVar25 = __nptr;
        while (iVar8 != 0) {
          *pcVar25 = (char)*string;
          pcVar25 = pcVar25 + 1;
          *_Dst = (char)*string;
          _Dst = _Dst + 1;
          iVar8 = isdigit((uint)(ushort)string[1]);
          string = string + 1;
        }
        *pcVar25 = '\0';
        iVar9 = atoi(__nptr);
        if (iVar9 < 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001c53c6;
          SetLastError(0x54f);
          bVar4 = true;
          uVar21 = 0xffffffff;
          iVar20 = local_43c;
          iVar8 = -1;
          goto LAB_001c4e64;
        }
      }
      local_440 = -1;
      cVar22 = *string;
      bVar5 = true;
      bVar4 = false;
      if ((ushort)cVar22 < 0x6c) {
        if (((cVar22 == L'I') && (string[1] == L'6')) && (string[2] == L'4')) {
          string = string + 3;
LAB_001c4b96:
          local_440 = 3;
        }
        else {
          bVar4 = false;
          if (cVar22 != L'L') {
            if (cVar22 == L'h') {
              string = string + 1;
              local_440 = 1;
              bVar4 = true;
              bVar5 = false;
            }
            goto LAB_001c4bab;
          }
          string = string + 1;
        }
        bVar4 = false;
      }
      else {
        if ((cVar22 != L'l') && (cVar22 != L'w')) {
          if (cVar22 != L'p') goto LAB_001c4bab;
          goto LAB_001c4b96;
        }
        cVar22 = string[1];
        if ((cVar22 == L'C') || (cVar22 == L'S')) {
          local_440 = 2;
        }
        else if (cVar22 == L'l') {
          string = string + 2;
          goto LAB_001c4b96;
        }
        bVar4 = false;
        string = string + 1;
        bVar5 = true;
      }
LAB_001c4bab:
      cVar22 = *string;
      uVar11 = (uint)(ushort)cVar22;
      if ((ushort)cVar22 < 0x53) {
        if (cVar22 == L'C') goto switchD_001c4bcf_caseD_63;
        if ((cVar22 == L'E') || (cVar22 == L'G')) goto switchD_001c4bcf_caseD_65;
        goto switchD_001c4bcf_caseD_59;
      }
      switch(cVar22) {
      case L'X':
      case L'd':
      case L'i':
      case L'o':
      case L'p':
      case L'u':
      case L'x':
        if (local_440 == 3) {
          eVar10 = strcpy_s(_Dst,0x400,"ll");
          if (eVar10 != 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001c53c6;
            SetLastError(0x7a);
            bVar4 = true;
            uVar21 = 3;
            iVar20 = local_43c;
            iVar8 = local_440;
            goto LAB_001c4e64;
          }
          sVar15 = strlen("ll");
          _Dst = _Dst + sVar15;
        }
        else {
          if (local_440 == 2) {
            *_Dst = 'l';
          }
          else {
            if (local_440 != 1) goto LAB_001c4c70;
            *_Dst = 'h';
          }
          _Dst = _Dst + 1;
        }
LAB_001c4c70:
        cVar22 = *string;
        string = string + 1;
        *_Dst = (char)cVar22;
        _Dst = _Dst + 1;
        _iStack_448 = 3;
        break;
      case L'Y':
      case L'Z':
      case L'\\':
      case L']':
      case L'^':
      case L'_':
      case L'`':
      case L'a':
      case L'b':
      case L'h':
      case L'j':
      case L'k':
      case L'l':
      case L'm':
      case L'q':
      case L'r':
      case L't':
      case L'v':
      case L'w':
        goto switchD_001c4bcf_caseD_59;
      case L'[':
        *_Dst = '[';
        if (string[1] == L'^') {
          _Dst[1] = '^';
          _Dst = _Dst + 2;
          string = string + 2;
        }
        else {
          _Dst = _Dst + 1;
          string = string + 1;
        }
        if (*string == L']') {
          *_Dst = ']';
          _Dst = _Dst + 1;
          string = string + 1;
        }
        if (*string == L'-') {
          *_Dst = '-';
          _Dst = _Dst + 1;
          string = string + 1;
        }
        while( true ) {
          while (cVar22 = *string, cVar22 == L'-') {
            cVar22 = string[1];
            if (cVar22 == L']') {
              string = string + 1;
              *_Dst = '-';
              _Dst = _Dst + 1;
            }
            else {
              cVar6 = string[-1];
              if ((ushort)(cVar22 & 0xffU) < (ushort)(byte)cVar6) {
                _Dst[-1] = (char)cVar22;
                cVar22 = (char16_t)(byte)cVar6;
              }
              *_Dst = '-';
              _Dst[1] = (char)cVar22;
              _Dst = _Dst + 2;
              string = string + 2;
            }
          }
          if (cVar22 == L'\0') goto LAB_001c4e2d;
          if (cVar22 == L']') break;
          *_Dst = (char)cVar22;
          _Dst = _Dst + 1;
          string = string + 1;
        }
        *_Dst = ']';
        _Dst = _Dst + 1;
        string = string + 1;
LAB_001c4e2d:
        _iStack_448 = 6;
        break;
      case L'c':
switchD_001c4bcf_caseD_63:
        iVar8 = local_440;
        if (uVar11 == 99) {
          iVar8 = 2;
        }
        if (bVar5) {
          local_440 = iVar8;
        }
        if (local_440 == 2) {
          *_Dst = 'l';
          _Dst = _Dst + 1;
        }
        *_Dst = 'c';
        _Dst = _Dst + 1;
        string = string + 1;
        _iStack_448 = 1;
        break;
      case L'e':
      case L'f':
      case L'g':
switchD_001c4bcf_caseD_65:
        string = string + 1;
        iVar8 = tolower(uVar11);
        *_Dst = (char)iVar8;
        _Dst = _Dst + 1;
        _iStack_448 = 5;
        break;
      case L'n':
        if (bVar4) {
          *_Dst = 'h';
          _Dst = _Dst + 1;
        }
        cVar22 = *string;
        string = string + 1;
        *_Dst = (char)cVar22;
        _Dst = _Dst + 1;
        _iStack_448 = 4;
        break;
      case L's':
switchD_001c4bcf_caseD_73:
        iVar8 = local_440;
        if (uVar11 == 0x73) {
          iVar8 = 2;
        }
        if (bVar5) {
          local_440 = iVar8;
        }
        if (local_440 == 2) {
          *_Dst = 'l';
          _Dst = _Dst + 1;
        }
        *_Dst = 's';
        _Dst = _Dst + 1;
        string = string + 1;
        _iStack_448 = 2;
        break;
      default:
        if (uVar11 == 0x53) goto switchD_001c4bcf_caseD_73;
        goto switchD_001c4bcf_caseD_59;
      }
      bVar4 = false;
LAB_001c4e3c:
      _Dst[0] = '%';
      _Dst[1] = 'n';
      _Dst[2] = '\0';
      PAL_free(__nptr);
      uVar21 = _iStack_448;
      iVar20 = local_43c;
      iVar8 = local_440;
LAB_001c4e64:
      if (bVar4) {
LAB_001c4e6c:
        if ((*string == *pWVar24) && ((int)uVar21 != 7)) {
          string = string + 1;
          pWVar23 = pWVar24 + 1;
          _iStack_448 = uVar21;
          goto LAB_001c4e98;
        }
LAB_001c539e:
        iVar8 = iVar20;
        break;
      }
      iVar16 = (int)uVar21;
      _iStack_448 = uVar21;
      if ((iVar8 == 2) && (iVar16 - 1U < 2)) {
        uVar11 = (uint)(iVar9 == -1 && iVar16 == 1);
        uVar21 = (ulong)uVar11;
        if (iVar9 == -1 && iVar16 == 1) {
          iVar9 = 1;
        }
        if (pWVar24[uVar21] != L'\0') {
          iVar8 = isspace((uint)(ushort)pWVar24[uVar21]);
          if ((iVar8 == 0) && (iVar9 == -1 || (int)uVar11 < iVar9)) {
            while( true ) {
              uVar11 = uVar11 + 1;
              uVar21 = (ulong)(int)uVar11;
              if (pWVar24[uVar21] == L'\0') break;
              iVar8 = isspace((uint)(ushort)pWVar24[uVar21]);
              if ((iVar8 != 0) || (iVar9 != -1 && iVar9 <= (int)uVar11)) break;
            }
          }
        }
        pWVar23 = pWVar24 + uVar21;
        iVar20 = local_43c;
        if (bVar3) {
          uVar1 = ap->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            plVar14 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            plVar14 = (long *)ap->overflow_arg_area;
            ap->overflow_arg_area = plVar14 + 1;
          }
          lVar18 = *plVar14;
          if (0 < (int)uVar11) {
            uVar19 = 0;
            do {
              *(WCHAR *)(lVar18 + uVar19 * 2) = pWVar24[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar11 != uVar19);
          }
          if (iStack_448 == 2) {
            *(undefined2 *)(lVar18 + uVar21 * 2) = 0;
          }
          iVar20 = local_43c + 1;
        }
      }
      else {
        pWVar23 = pWVar24;
        if (iVar16 == 4) {
          uVar11 = ap->gp_offset;
          if (iVar8 == 1) {
            if (uVar11 < 0x29) {
              puVar17 = (undefined8 *)((ulong)uVar11 + (long)ap->reg_save_area);
              ap->gp_offset = uVar11 + 8;
            }
            else {
              puVar17 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar17 + 1;
            }
            local_468 = (int)Buffer;
            *(short *)*puVar17 = (short)((uint)((int)pWVar24 - local_468) >> 1);
          }
          else {
            if (uVar11 < 0x29) {
              puVar17 = (undefined8 *)((ulong)uVar11 + (long)ap->reg_save_area);
              ap->gp_offset = uVar11 + 8;
            }
            else {
              puVar17 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar17 + 1;
            }
            *(int *)*puVar17 = (int)((ulong)((long)pWVar24 - (long)Buffer) >> 1);
          }
        }
        else {
          iVar8 = WideCharToMultiByte(0,0,pWVar24,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
          if (iVar8 == 0) {
            fprintf(_stderr,"] %s %s:%d","PAL_wvsscanf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                   );
            pFVar7 = _stderr;
            DVar12 = GetLastError();
            fprintf(pFVar7,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar12);
LAB_001c5254:
            iVar9 = 1;
            iVar20 = local_43c;
          }
          else {
            lpMultiByteStr = (LPSTR)PAL_malloc((long)iVar8);
            if (lpMultiByteStr == (LPSTR)0x0) {
              if (PAL_InitializeChakraCoreCalled == false) {
LAB_001c53c6:
                abort();
              }
              SetLastError(8);
              goto LAB_001c5254;
            }
            iVar8 = WideCharToMultiByte(0,0,pWVar24,iVar8,lpMultiByteStr,iVar8,(LPCSTR)0x0,
                                        (LPBOOL)0x0);
            if (iVar8 == 0) {
              fprintf(_stderr,"] %s %s:%d","PAL_wvsscanf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                     );
              pFVar7 = _stderr;
              DVar12 = GetLastError();
              fprintf(pFVar7,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar12);
              PAL_free(lpMultiByteStr);
              goto LAB_001c5254;
            }
            if (bVar3) {
              if (iStack_448 == 6) {
                sVar15 = strlen((char *)&local_438);
                iVar8 = (int)sVar15 + 1;
                while (iVar8 != 0) {
                  lVar18 = (long)iVar8;
                  iVar8 = iVar8 + -1;
                  *(undefined1 *)((long)&local_438 + lVar18) =
                       *(undefined1 *)((long)&local_438 + (long)iVar8);
                }
                local_438 = 0x2a25;
                local_44c = 0;
                iVar8 = 0;
                sscanf_s(lpMultiByteStr,(char *)&local_438,&local_44c);
                if ((ulong)local_44c != 0) {
                  uVar11 = ap->gp_offset;
                  if ((ulong)uVar11 < 0x29) {
                    plVar14 = (long *)((ulong)uVar11 + (long)ap->reg_save_area);
                    ap->gp_offset = uVar11 + 8;
                  }
                  else {
                    plVar14 = (long *)ap->overflow_arg_area;
                    ap->overflow_arg_area = plVar14 + 1;
                  }
                  lVar18 = *plVar14;
                  if (0 < (int)local_44c) {
                    uVar21 = 0;
                    do {
                      *(WCHAR *)(lVar18 + uVar21 * 2) = pWVar24[uVar21];
                      uVar21 = uVar21 + 1;
                    } while (local_44c != uVar21);
                  }
                  *(undefined2 *)(lVar18 + (long)(int)local_44c * 2) = 0;
                  iVar8 = 1;
                }
              }
              else {
                uVar11 = ap->gp_offset;
                if ((ulong)uVar11 < 0x29) {
                  puVar17 = (undefined8 *)((ulong)uVar11 + (long)ap->reg_save_area);
                  ap->gp_offset = uVar11 + 8;
                }
                else {
                  puVar17 = (undefined8 *)ap->overflow_arg_area;
                  ap->overflow_arg_area = puVar17 + 1;
                }
                uVar2 = *puVar17;
                if (iStack_448 == 1) {
                  iVar8 = iVar9;
                  if (iVar9 < 2) {
                    iVar8 = 1;
                  }
                }
                else {
                  iVar8 = 0;
                  if (iStack_448 == 2) {
                    if (iVar9 < 1) {
                      sVar13 = PAL_wcslen(Buffer);
                      iVar9 = (int)sVar13;
                    }
                    iVar8 = iVar9 + 1;
                  }
                }
                if (iVar8 == 0) {
                  iVar8 = sscanf_s(lpMultiByteStr,(char *)&local_438,uVar2);
                }
                else {
                  iVar8 = sscanf_s(lpMultiByteStr,(char *)&local_438,uVar2);
                }
              }
            }
            else {
              iVar8 = sscanf_s(lpMultiByteStr,(char *)&local_438,&local_44c);
            }
            PAL_free(lpMultiByteStr);
            if (iVar8 < 1) {
              iVar9 = 3;
              iVar20 = local_43c;
            }
            else {
              iVar9 = 0;
              pWVar23 = pWVar24 + (int)local_44c;
              iVar20 = local_43c + iVar8;
            }
          }
          if (iVar9 != 0) {
            iVar8 = -1;
            if (iVar9 == 3) goto LAB_001c539e;
            break;
          }
        }
      }
LAB_001c4e98:
      cVar22 = *string;
      pWVar24 = pWVar23;
      Format = string;
      iVar8 = iVar20;
    } while (cVar22 != L'\0');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == TempBuff._1016_8_) {
    return iVar8;
  }
  __stack_chk_fail();
switchD_001c4bcf_caseD_59:
  _iStack_448 = (ulong)((uint)(cVar22 == L' ') * 8 - 1);
  bVar4 = true;
  goto LAB_001c4e3c;
}

Assistant:

__attribute__((no_instrument_function))
int PAL_wvsscanf(LPCWSTR Buffer, LPCWSTR Format, va_list ap)
{
    INT Length = 0;
    LPCWSTR Buff = Buffer;
    LPCWSTR Fmt = Format;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    BOOL Store;
    INT Width;
    INT Prefix;
    INT Type = -1;

    while (*Fmt)
    {
        if (!*Buff && Length == 0)
        {
            Length = EOF;
            break;
        }
        /* remove any number of blanks */
        else if (isspace(*Fmt))
        {
            while (isspace(*Buff))
            {
                ++Buff;
            }
            ++Fmt;
        }
        else if (*Fmt == '%' &&
                 Internal_ScanfExtractFormatW(&Fmt, TempBuff, sizeof(TempBuff), &Store,
                                              &Width, &Prefix, &Type))
        {
            if (Prefix == SCANF_PREFIX_LONG &&
                (Type == SCANF_TYPE_STRING || Type == SCANF_TYPE_CHAR))
            {
                int len = 0;
                WCHAR *charPtr = 0;

                /* a single character */
                if (Type == SCANF_TYPE_CHAR && Width == -1)
                {
                    len = Width = 1;
                }

                /* calculate length of string to copy */
                while (Buff[len] && !isspace(Buff[len]))
                {
                    if (Width != -1 && len >= Width)
                    {
                        break;
                    }
                    ++len;
                }

                if (Store)
                {
                    int i;
                    charPtr = va_arg(ap, WCHAR *);

                    for (i = 0; i < len; i++)
                    {
                        charPtr[i] = Buff[i];
                    }
                    if (Type == SCANF_TYPE_STRING)
                    {
                        /* end string */
                        charPtr[len] = 0;
                    }
                    ++Length;
                }
                Buff += len;
            }
            /* this places the number of bytes stored into the next arg */
            else if (Type == SCANF_TYPE_N)
            {
                if (Prefix == SCANF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = Buff - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = Buff - Buffer;
                }
            }
            /* types that sscanf can handle */
            else
            {
                int ret;
                int n;
                int size;
                LPSTR newBuff = 0;
                LPVOID voidPtr = NULL;

                size = WideCharToMultiByte(CP_ACP, 0, Buff, -1, 0, 0, 0, 0);
                if (!size)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    return -1;
                }
                newBuff = (LPSTR) PAL_malloc(size);
                if (!newBuff)
                {
                    ERROR("PAL_malloc failed\n");
                    SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    return -1;
                }
                size = WideCharToMultiByte(CP_ACP, 0, Buff, size,
                                           newBuff, size, 0, 0);
                if (!size)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    PAL_free(newBuff);
                    return -1;
                }

                if (Store)
                {
                    if (Type == SCANF_TYPE_BRACKETS)
                    {
                        WCHAR *strPtr;
                        int i;

                        /* add a '*' to %[] --> %*[]  */
                        i = strlen(TempBuff) + 1;
                        while (i)
                        {
                            /* shift everything right one */
                            TempBuff[i] = TempBuff[i - 1];
                            --i;
                        }
                        TempBuff[0] = '%';
                        TempBuff[1] = '*';

                        /* %n doesn't count as a conversion. Since we're
                           suppressing conversion of the %[], sscanf will
                           always return 0, so we can't use the return value
                           to determine success. Set n to 0 before the call; if
                           it's still 0 afterwards, we know the call failed */
                        n = 0;
                        sscanf_s(newBuff, TempBuff, &n);
                        if(0 == n)
                        {
                            /* sscanf failed, nothing matched. set ret to 0,
                               so we know we have to break */
                            ret = 0;
                        }
                        else
                        {
                            strPtr = va_arg(ap, WCHAR *);
                            for (i = 0; i < n; i++)
                            {
                                strPtr[i] = Buff[i];
                            }
                            strPtr[n] = 0; /* end string */
                            ret = 1;
                        }
                    }
                    else
                    {
                        voidPtr = va_arg(ap, LPVOID);
                        // sscanf_s requires that if we are trying to read "%s" or "%c", then
                        // the size of the buffer must follow the buffer we are trying to read into.
                        unsigned typeLen = 0;
                        if (Type == SCANF_TYPE_STRING)
                        {
                            // We don't really know the size of the destination buffer provided by the
                            // caller. So we have to assume that the caller has allocated enough space
                            // to hold either the width specified in the format or the entire input
                            // string plus '\0'.
                            typeLen = ((Width > 0) ? Width : PAL_wcslen(Buffer)) + 1;
                        }
                        else if (Type == SCANF_TYPE_CHAR)
                        {
                            // Check whether the format string contains number of characters
                            // that should be read from the input string.
                            // Note: '\0' does not get appended in the "%c" case.
                            typeLen = (Width > 0) ? Width : 1;
                        }

                        if (typeLen > 0)
                        {
                            ret = sscanf_s(newBuff, TempBuff, voidPtr, typeLen, &n);
                        }
                        else
                            ret = sscanf_s(newBuff, TempBuff, voidPtr, &n);
                    }
                }
                else
                {
                    ret = sscanf_s(newBuff, TempBuff, &n);
                }

#if SSCANF_CANNOT_HANDLE_MISSING_EXPONENT
                if ((ret == 0) && (Type == SCANF_TYPE_FLOAT))
                {
                    ret = SscanfFloatCheckExponent(newBuff, TempBuff, voidPtr, &n);
                }
#endif // SSCANF_CANNOT_HANDLE_MISSING_EXPONENT

                PAL_free(newBuff);
                if (ret > 0)
                {
                    Length += ret;
                }
                else
                {
                    /* no match; break scan */
                    break;
                }
                Buff += n;
            }
       }
        else
        {
            /* grab, but not store */
            if (*Fmt == *Buff && Type != SCANF_TYPE_SPACE)
            {
                ++Fmt;
                ++Buff;
            }
            /* doesn't match, break scan */
            else
            {
                break;
            }
        }
    }

    return Length;
}